

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_type_lookupFallbackSelector
          (sysbvm_context_t *context,sysbvm_tuple_t type,sysbvm_tuple_t selector)

{
  sysbvm_tuple_t context_00;
  _Bool _Var1;
  sysbvm_tuple_t type_00;
  sysbvm_context_t *local_38;
  sysbvm_tuple_t found;
  sysbvm_tuple_t methodDictionary;
  sysbvm_tuple_t selector_local;
  sysbvm_tuple_t type_local;
  sysbvm_context_t *context_local;
  
  methodDictionary = selector;
  selector_local = type;
  type_local = (sysbvm_tuple_t)context;
  _Var1 = sysbvm_tuple_isNonNullPointer(type);
  if (_Var1) {
    _Var1 = sysbvm_tuple_isDummyValue(selector_local);
    if (_Var1) {
      context_local = (sysbvm_context_t *)0x0;
    }
    else {
      found = sysbvm_type_getFallbackMethodDictionary(selector_local);
      if (found != 0) {
        local_38 = (sysbvm_context_t *)0x0;
        _Var1 = sysbvm_methodDictionary_find(found,methodDictionary,(sysbvm_tuple_t *)&local_38);
        if (_Var1) {
          return (sysbvm_tuple_t)local_38;
        }
      }
      context_00 = type_local;
      type_00 = sysbvm_type_getSupertype(selector_local);
      context_local =
           (sysbvm_context_t *)
           sysbvm_type_lookupFallbackSelector
                     ((sysbvm_context_t *)context_00,type_00,methodDictionary);
    }
  }
  else {
    context_local = (sysbvm_context_t *)0x0;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_lookupFallbackSelector(sysbvm_context_t *context, sysbvm_tuple_t type, sysbvm_tuple_t selector)
{
    if(!sysbvm_tuple_isNonNullPointer(type)) return SYSBVM_NULL_TUPLE;
    if(sysbvm_tuple_isDummyValue(type)) return SYSBVM_NULL_TUPLE;
    sysbvm_tuple_t methodDictionary = sysbvm_type_getFallbackMethodDictionary(type);
    if(methodDictionary)
    {
        sysbvm_tuple_t found = SYSBVM_NULL_TUPLE;
        if(sysbvm_methodDictionary_find(methodDictionary, selector, &found))
            return found;
    }

    return sysbvm_type_lookupFallbackSelector(context, sysbvm_type_getSupertype(type), selector);
}